

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

bool __thiscall ExternalTester::testAllAcceleration(ExternalTester *this)

{
  Two3KExpSinCos *f;
  TwoOneExpSinCos *f_00;
  TwoOneExpNX2 *f_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  int t;
  uint uVar7;
  TasmanianSparseGrid grid;
  
  f = &this->f23Kexpsincos;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(&grid);
  iVar3 = (**(this->f23Kexpsincos).super_BaseFunction._vptr_BaseFunction)(f);
  iVar4 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            ((int)&grid,iVar3,iVar4,type_qptotal,rule_clenshawcurtis,(int *)0x1,0.0,0.0,(char *)0x0,
             (int *)0x0);
  bVar1 = testAcceleration(this,&f->super_BaseFunction,&grid);
  f_00 = &this->f21expsincos;
  iVar3 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar4 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            ((int)&grid,iVar3,iVar4,type_qptotal,rule_clenshawcurtis,(int *)0x1,0.0,0.0,(char *)0x0,
             (int *)0x0);
  if (bVar1) {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,&grid);
    if (!bVar1) goto LAB_00111590;
    bVar1 = true;
    if (this->verbose == true) {
      poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
      poVar5 = std::operator<<(poVar5,"global");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
      poVar5 = std::operator<<(poVar5,"Pass");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else {
LAB_00111590:
    poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
    poVar5 = std::operator<<(poVar5,"global");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    poVar5 = std::operator<<(poVar5,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar1 = false;
  }
  iVar3 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
  iVar4 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeSequenceGrid
            ((int)&grid,iVar3,iVar4,type_qptotal,rule_clenshawcurtis,(int *)0x6,(int *)0x0);
  if (bVar1) {
    bVar1 = testAcceleration(this,&f->super_BaseFunction,&grid);
  }
  else {
    bVar1 = false;
  }
  iVar3 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar4 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeSequenceGrid
            ((int)&grid,iVar3,iVar4,type_qptotal,rule_clenshawcurtis,(int *)0x6,(int *)0x0);
  if (bVar1 == false) {
LAB_001116fc:
    poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
    poVar5 = std::operator<<(poVar5,"sequence");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    poVar5 = std::operator<<(poVar5,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,&grid);
    if (!bVar1) goto LAB_001116fc;
    bVar1 = true;
    if (this->verbose == true) {
      poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
      poVar5 = std::operator<<(poVar5,"sequence");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
      poVar5 = std::operator<<(poVar5,"Pass");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  for (uVar7 = 0; uVar7 != 0xc; uVar7 = uVar7 + 1) {
    iVar3 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
    iVar4 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
    TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
              ((int)&grid,iVar3,iVar4,6 - (uint)(uVar7 < 4),uVar7 >> 2,
               (int *)(ulong)*(uint *)(&DAT_0012d610 + (ulong)(uVar7 & 3) * 4));
    if (bVar1 == false) {
      bVar1 = false;
    }
    else {
      bVar1 = testAcceleration(this,&f->super_BaseFunction,&grid);
    }
  }
  f_01 = &this->f21nx2;
  iVar3 = TwoOneExpNX2::getNumInputs(f_01);
  iVar4 = TwoOneExpNX2::getNumOutputs(f_01);
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)&grid,iVar3,iVar4,5,rule_clenshawcurtis,(int *)0x25);
  TasGrid::TasmanianSparseGrid::favorSparseAcceleration(SUB81(&grid,0));
  if (bVar1 == false) {
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_01->super_BaseFunction,&grid);
  }
  iVar3 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar4 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
            ((int)&grid,iVar3,iVar4,5,rule_clenshawcurtis0,(int *)0x27);
  TasGrid::TasmanianSparseGrid::favorSparseAcceleration(SUB81(&grid,0));
  if (bVar1 == false) {
LAB_0011190a:
    poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
    poVar5 = std::operator<<(poVar5,"local polynomial");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    poVar5 = std::operator<<(poVar5,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,&grid);
    if (!bVar1) goto LAB_0011190a;
    bVar1 = true;
    if (this->verbose == true) {
      poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
      poVar5 = std::operator<<(poVar5,"local polynomial");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
      poVar5 = std::operator<<(poVar5,"Pass");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  iVar3 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
  iVar4 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeFourierGrid
            ((int)&grid,iVar3,iVar4,type_iptotal,(int *)0x1,(int *)0x0);
  if (bVar1) {
    bVar1 = testAcceleration(this,&f->super_BaseFunction,&grid);
  }
  else {
    bVar1 = false;
  }
  iVar3 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar4 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeFourierGrid
            ((int)&grid,iVar3,iVar4,type_iptotal,(int *)0x1,(int *)0x0);
  if (bVar1 == false) {
LAB_00111a6e:
    poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
    poVar5 = std::operator<<(poVar5,"fourier");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    poVar5 = std::operator<<(poVar5,"FAIL");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar1 = false;
  }
  else {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,&grid);
    if (!bVar1) goto LAB_00111a6e;
    bVar1 = true;
    if (this->verbose == true) {
      poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
      poVar5 = std::operator<<(poVar5,"fourier");
      *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
      poVar5 = std::operator<<(poVar5,"Pass");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  iVar3 = (**(f->super_BaseFunction)._vptr_BaseFunction)(f);
  iVar4 = (*(f->super_BaseFunction)._vptr_BaseFunction[1])(f);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)&grid,iVar3,iVar4,2,(int *)0x3);
  if (bVar1) {
    bVar1 = testAcceleration(this,&f->super_BaseFunction,&grid);
  }
  else {
    bVar1 = false;
  }
  iVar3 = (**(f_00->super_BaseFunction)._vptr_BaseFunction)(f_00);
  iVar4 = (*(f_00->super_BaseFunction)._vptr_BaseFunction[1])(f_00);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)&grid,iVar3,iVar4,4,(int *)0x1);
  if (bVar1 != false) {
    bVar1 = testAcceleration(this,&f_00->super_BaseFunction,&grid);
    if (bVar1) {
      bVar2 = this->verbose;
      if ((bool)bVar2 == true) {
        poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
        *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
        poVar5 = std::operator<<(poVar5,"wavelet");
        *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
        poVar5 = std::operator<<(poVar5,"Pass");
        std::endl<char,std::char_traits<char>>(poVar5);
        bVar2 = this->verbose;
      }
      bVar1 = true;
      if ((bVar2 & 1) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
        *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
        poVar5 = std::operator<<(poVar5,"caching");
        *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
        poVar5 = std::operator<<(poVar5,"Pass");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      goto LAB_00111ce9;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
  poVar5 = std::operator<<(poVar5,"wavelet");
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
  poVar5 = std::operator<<(poVar5,"FAIL");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
  poVar5 = std::operator<<(poVar5,"caching");
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
  poVar5 = std::operator<<(poVar5,"FAIL");
  std::endl<char,std::char_traits<char>>(poVar5);
  bVar1 = false;
LAB_00111ce9:
  bVar2 = this->verbose;
  if ((bool)bVar2 == true) {
    poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
    poVar5 = std::operator<<(poVar5,"gpu-to-gpu");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    poVar5 = std::operator<<(poVar5,"Skipped (needs Tasmanian_ENABLE_CUDA=ON)");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar2 = this->verbose;
  }
  if ((bVar2 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"      Accelerated");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0x1c;
    poVar5 = std::operator<<(poVar5,"load-values");
    *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
    poVar5 = std::operator<<(poVar5,"Skipped (needs Tasmanian_ENABLE_CUDA=ON)");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"      Acceleration                        all");
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xf;
  pcVar6 = "FAIL";
  if (bVar1 != false) {
    pcVar6 = "Pass";
  }
  poVar5 = std::operator<<(poVar5,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar5);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid(&grid);
  return bVar1;
}

Assistant:

bool ExternalTester::testAllAcceleration() const{
    const BaseFunction *f = &f23Kexpsincos;
    const BaseFunction *f1out = &f21expsincos;
    TasmanianSparseGrid grid;
    bool pass = true;

    int wsecond = 28, wthird = 15;

    grid.makeGlobalGrid(f->getNumInputs(), f->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_clenshawcurtis);
    pass = pass && testAcceleration(f, grid);
    grid.makeGlobalGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_clenshawcurtis);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "global" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "global" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeSequenceGrid(f->getNumInputs(), f->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_leja);
    pass = pass && testAcceleration(f, grid);
    grid.makeSequenceGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, TasGrid::type_level, TasGrid::rule_leja);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "sequence" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "sequence" << setw(wthird) << "FAIL" << endl;
    }

    // for the purpose of testing CUDA evaluations, test all three localp rules vs orders 0, 1, and 2
    // for order 0, regardless of the selected rule, thegrid should switch to localp
    TasGrid::TypeOneDRule pwp_rule[4] = {TasGrid::rule_localp, TasGrid::rule_localp0, TasGrid::rule_semilocalp, TasGrid::rule_localpb};
    for(int t=0; t<12; t++){
        grid.makeLocalPolynomialGrid(f->getNumInputs(), f->getNumOutputs(), ((t / 4 == 0) ? 5 : 6), (t / 4), pwp_rule[t % 4]);
        pass = pass && testAcceleration(f, grid);
    }
    // test cusparse sparse mat times dense vec used in accel_type cuda, also try both sparse and dense flavors
    grid.makeLocalPolynomialGrid(f21nx2.getNumInputs(), f21nx2.getNumOutputs(), 5, 1, TasGrid::rule_localp);
    grid.favorSparseAcceleration(true);
    pass = pass && testAcceleration(&f21nx2, grid);
    grid.makeLocalPolynomialGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 5, 2, TasGrid::rule_semilocalp);
    grid.favorSparseAcceleration(false);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "local polynomial" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "local polynomial" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeFourierGrid(f->getNumInputs(), f->getNumOutputs(), 4, TasGrid::type_level);
    pass = pass && testAcceleration(f, grid);
    grid.makeFourierGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 4, TasGrid::type_level);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "fourier" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "fourier" << setw(wthird) << "FAIL" << endl;
    }

    grid.makeWaveletGrid(f->getNumInputs(), f->getNumOutputs(), 2, 3);
    pass = pass && testAcceleration(f, grid);
    grid.makeWaveletGrid(f1out->getNumInputs(), f1out->getNumOutputs(), 4, 1);
    pass = pass && testAcceleration(f1out, grid);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "wavelet" << setw(wthird) << "FAIL" << endl;
    }

    pass = pass && testGpuCaching();
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "caching" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "caching" << setw(wthird) << "FAIL" << endl;
    }

    #ifdef Tasmanian_ENABLE_GPU
    pass = pass && testGPU2GPUevaluations();
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "FAIL" << endl;
    }
    #else
    if (verbose) cout << "      Accelerated" << setw(wsecond) << "gpu-to-gpu" << setw(wthird) << "Skipped (needs Tasmanian_ENABLE_CUDA=ON)" << endl;
    #endif // Tasmanian_ENABLE_GPU

    #ifdef Tasmanian_ENABLE_GPU
    pass = pass && testAcceleratedLoadValues(rule_clenshawcurtis) && testAcceleratedLoadValues(rule_rleja) &&
                   testAcceleratedLoadValues(rule_localp) && testAcceleratedLoadValues(rule_fourier) && testAcceleratedLoadValues(rule_wavelet);
    if (pass){
        if (verbose) cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "Pass" << endl;
    }else{
        cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "FAIL" << endl;
    }
    #else
    if (verbose) cout << "      Accelerated" << setw(wsecond) << "load-values" << setw(wthird) << "Skipped (needs Tasmanian_ENABLE_CUDA=ON)" << endl;
    #endif

    cout << "      Acceleration                        all" << setw(15) << ((pass) ? "Pass" : "FAIL") << endl;

    return pass;
}